

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<32u,unsigned_int,void,true>::wr_string<char*>
          (uintwide_t<32u,unsigned_int,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  char acStack_3a [26];
  
  iVar3 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar3 == 0x10) {
    acStack_3a[10] = '\0';
    acStack_3a[0xb] = '\0';
    acStack_3a[0xc] = '\0';
    acStack_3a[0xd] = '\0';
    acStack_3a[0xe] = '\0';
    acStack_3a[0xf] = '\0';
    acStack_3a[0x10] = 0;
    acStack_3a[2] = '\0';
    acStack_3a[3] = '\0';
    acStack_3a[4] = '\0';
    acStack_3a[5] = '\0';
    acStack_3a[6] = '\0';
    acStack_3a[7] = '\0';
    acStack_3a[8] = '\0';
    acStack_3a[9] = 0;
    if (*(uint *)this == 0) {
      acStack_3a[0x10] = 0x30;
      uVar5 = 0xe;
    }
    else {
      uVar5 = 0xf;
      uVar8 = *(uint *)this;
      do {
        cVar7 = (char)(uVar8 & 0xf);
        cVar6 = cVar7 + '0';
        if (9 < (uVar8 & 0xf)) {
          cVar6 = cVar7 + !is_uppercase * ' ' + '7';
        }
        acStack_3a[uVar5 + 1] = cVar6;
        uVar5 = uVar5 - 1;
        bVar10 = 0xf < uVar8;
        uVar8 = uVar8 >> 4;
      } while (bVar10);
    }
    if (show_base && 1 < (long)uVar5) {
      acStack_3a[(ulong)((int)uVar5 - 1) + 2] = !is_uppercase << 5 | 0x58;
      uVar5 = uVar5 - 2;
      acStack_3a[(uVar5 & 0xffffffff) + 2] = '0';
    }
    if ((show_pos) && (0 < (long)uVar5)) {
      uVar5 = uVar5 - 1;
      acStack_3a[(uVar5 & 0xffffffff) + 2] = '+';
    }
    if (field_width != 0) {
      uVar9 = 0xf;
      if (field_width < 0xf) {
        uVar9 = field_width;
      }
      uVar4 = uVar5;
      while ((long)(uVar9 ^ 0xf) < (long)uVar4) {
        uVar4 = uVar4 - 1;
        acStack_3a[(uVar4 & 0xffffffff) + 2] = fill_char_str;
        uVar5 = uVar9 ^ 0xf;
      }
    }
    acStack_3a[0x11] = 0;
    lVar2 = 0;
    do {
      cVar7 = acStack_3a[lVar2 + uVar5 + 2];
      str_result[lVar2] = cVar7;
      lVar2 = lVar2 + 1;
    } while (cVar7 != '\0');
    return true;
  }
  if (iVar3 != 10) {
    if (iVar3 != 8) {
      return false;
    }
    uVar8 = *(uint *)this;
    acStack_3a[2] = '\0';
    acStack_3a[3] = '\0';
    acStack_3a[4] = '\0';
    acStack_3a[5] = '\0';
    acStack_3a[6] = '\0';
    acStack_3a[7] = '\0';
    acStack_3a[8] = '\0';
    acStack_3a[9] = 0;
    acStack_3a[10] = '\0';
    acStack_3a[0xb] = '\0';
    acStack_3a[0xc] = '\0';
    acStack_3a[0xd] = '\0';
    acStack_3a[0xe] = '\0';
    acStack_3a[0xf] = '\0';
    acStack_3a[0x10] = 0;
    acStack_3a[0x11] = 0;
    acStack_3a[0x12] = '\0';
    acStack_3a[0x13] = '\0';
    if (uVar8 == 0) {
      acStack_3a[0x12] = '\0';
      acStack_3a[0x13] = '0';
      uVar5 = 0x11;
    }
    else {
      uVar9 = 0x12;
      do {
        uVar5 = uVar9 - 1;
        acStack_3a[uVar9 + 1] = (byte)uVar8 & 7 | 0x30;
        if (uVar8 < 8) break;
        uVar8 = uVar8 >> 3;
        bVar10 = uVar9 != 1;
        uVar9 = uVar5;
      } while (bVar10);
    }
    if (show_base && uVar5 != 0) {
      uVar5 = uVar5 - 1;
      acStack_3a[(uVar5 & 0xffffffff) + 2] = '0';
    }
    if (show_pos && uVar5 != 0) {
      uVar5 = uVar5 - 1;
      acStack_3a[(uVar5 & 0xffffffff) + 2] = '+';
    }
    if (field_width != 0) {
      lVar2 = 0;
      if (field_width < 0x13) {
        lVar2 = 0x12 - field_width;
      }
      while (lVar2 < (long)uVar5) {
        uVar5 = uVar5 - 1;
        acStack_3a[(uVar5 & 0xffffffff) + 2] = fill_char_str;
      }
    }
    acStack_3a[0x14] = 0;
    lVar2 = 0;
    do {
      cVar7 = acStack_3a[lVar2 + uVar5 + 2];
      str_result[lVar2] = cVar7;
      lVar2 = lVar2 + 1;
    } while (cVar7 != '\0');
    return true;
  }
  uVar8 = *(uint *)this;
  acStack_3a[2] = '\0';
  acStack_3a[3] = '\0';
  acStack_3a[4] = '\0';
  acStack_3a[5] = '\0';
  acStack_3a[6] = '\0';
  acStack_3a[7] = '\0';
  acStack_3a[8] = '\0';
  acStack_3a[9] = 0;
  acStack_3a[10] = '\0';
  acStack_3a[0xb] = '\0';
  acStack_3a[0xc] = '\0';
  acStack_3a[0xd] = '\0';
  acStack_3a[0xe] = '\0';
  acStack_3a[0xf] = '\0';
  acStack_3a[0x10] = 0;
  acStack_3a[0x11] = 0;
  acStack_3a[0x12] = '\0';
  acStack_3a[0x13] = '\0';
  if (uVar8 == 0) {
    acStack_3a[0x12] = '\0';
    acStack_3a[0x13] = '0';
    uVar5 = 0x11;
  }
  else {
    uVar1 = -uVar8;
    if (0 < (int)uVar8) {
      uVar1 = uVar8;
    }
    uVar9 = 0x13;
    do {
      uVar5 = uVar9;
      acStack_3a[uVar5] = (char)(uVar1 / 10) * -10 + (char)uVar1 + '0';
      uVar9 = uVar5 - 1;
      if (uVar9 < 2) break;
      bVar10 = 9 < uVar1;
      uVar1 = uVar1 / 10;
    } while (bVar10);
    uVar5 = uVar5 - 2;
    if ((long)uVar9 < 2) goto LAB_0013c2a9;
  }
  if ((int)uVar8 < 0 || show_pos) {
    cVar7 = '-';
    if (-1 < (int)uVar8) {
      cVar7 = !show_pos * '\x02' + '+';
    }
    uVar5 = uVar5 - 1;
    acStack_3a[(uVar5 & 0xffffffff) + 2] = cVar7;
  }
LAB_0013c2a9:
  if (field_width != 0) {
    lVar2 = 0;
    if (field_width < 0x13) {
      lVar2 = 0x12 - field_width;
    }
    while (lVar2 < (long)uVar5) {
      uVar5 = uVar5 - 1;
      acStack_3a[(uVar5 & 0xffffffff) + 2] = fill_char_str;
    }
  }
  acStack_3a[0x14] = 0;
  lVar2 = 0;
  do {
    cVar7 = acStack_3a[lVar2 + uVar5 + 2];
    str_result[lVar2] = cVar7;
    lVar2 = lVar2 + 1;
  } while (cVar7 != '\0');
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }